

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_verify
              (secp256k1_context *ctx,uchar *adaptor_sig162,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *enckey)

{
  int iVar1;
  undefined1 local_398 [8];
  secp256k1_gej pubkeyj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej derived_rp;
  secp256k1_ge enckey_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_ge rp;
  secp256k1_ge r;
  secp256k1_ge pubkey_ge;
  secp256k1_scalar msg;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_pubkey *enckey_local;
  uchar *msg32_local;
  secp256k1_pubkey *pubkey_local;
  uchar *adaptor_sig162_local;
  secp256k1_context *ctx_local;
  
  if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"adaptor_sig162 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (enckey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"enckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)&rp.infinity,(secp256k1_scalar *)&enckey_ge.infinity,
                       (secp256k1_ge *)(sp.d + 3),(secp256k1_scalar *)(sigr.d + 3),
                       (secp256k1_scalar *)(msg.d + 3),(secp256k1_scalar *)(dleq_proof_e.d + 3),
                       adaptor_sig162);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&derived_rp.infinity,enckey);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_dleq_verify
                          ((secp256k1_scalar *)(dleq_proof_e.d + 3),(secp256k1_scalar *)(msg.d + 3),
                           (secp256k1_ge *)(sp.d + 3),(secp256k1_ge *)&derived_rp.infinity,
                           (secp256k1_ge *)&rp.infinity);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          secp256k1_scalar_set_b32((secp256k1_scalar *)&pubkey_ge.infinity,msg32,(int *)0x0);
          iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&r.infinity,pubkey);
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            secp256k1_scalar_inverse_var
                      ((secp256k1_scalar *)(u1.d + 3),(secp256k1_scalar *)(sigr.d + 3));
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)(u2.d + 3),(secp256k1_scalar *)(u1.d + 3),
                       (secp256k1_scalar *)&pubkey_ge.infinity);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)&pubkeyj.infinity,(secp256k1_scalar *)(u1.d + 3),
                       (secp256k1_scalar *)&enckey_ge.infinity);
            secp256k1_gej_set_ge((secp256k1_gej *)local_398,(secp256k1_ge *)&r.infinity);
            secp256k1_ecmult((secp256k1_gej *)(sn.d + 3),(secp256k1_gej *)local_398,
                             (secp256k1_scalar *)&pubkeyj.infinity,(secp256k1_scalar *)(u2.d + 3));
            iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)(sn.d + 3));
            if (iVar1 == 0) {
              secp256k1_gej_neg((secp256k1_gej *)(sn.d + 3),(secp256k1_gej *)(sn.d + 3));
              secp256k1_gej_add_ge_var
                        ((secp256k1_gej *)(sn.d + 3),(secp256k1_gej *)(sn.d + 3),
                         (secp256k1_ge *)(sp.d + 3),(secp256k1_fe *)0x0);
              ctx_local._4_4_ = secp256k1_gej_is_infinity((secp256k1_gej *)(sn.d + 3));
            }
            else {
              ctx_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_adaptor_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig162, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *enckey) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge pubkey_ge;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge enckey_ge;
    secp256k1_gej derived_rp;
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &rp, &sp, &dleq_proof_e, &dleq_proof_s, adaptor_sig162)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &enckey_ge, enckey)) {
        return 0;
    }
    /* DLEQ_verify((R', Y, R), dleq_proof) */
    if(!secp256k1_dleq_verify(&dleq_proof_s, &dleq_proof_e, &rp, &enckey_ge, &r)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    /* return R' == s'⁻¹(m * G + R.x * X) */
    secp256k1_scalar_inverse_var(&sn, &sp);
    secp256k1_scalar_mul(&u1, &sn, &msg);
    secp256k1_scalar_mul(&u2, &sn, &sigr);
    secp256k1_gej_set_ge(&pubkeyj, &pubkey_ge);
    secp256k1_ecmult(&derived_rp, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&derived_rp)) {
        return 0;
    }
    secp256k1_gej_neg(&derived_rp, &derived_rp);
    secp256k1_gej_add_ge_var(&derived_rp, &derived_rp, &rp, NULL);
    return secp256k1_gej_is_infinity(&derived_rp);
}